

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
llbuild::buildsystem::BuildSystem::attachDB(BuildSystem *this,StringRef path,string *error_out)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  pointer *__ptr;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> db;
  BuildDB *local_28;
  _Head_base<0UL,_llbuild::core::BuildDB_*,_false> local_20;
  
  pvVar2 = this->impl;
  uVar1 = *(uint *)(*(long *)((long)pvVar2 + 8) + 0x28);
  if (uVar1 < 0x10001) {
    core::createSQLiteBuildDB((core *)&local_28,path,uVar1 << 0x10 | 9,true,error_out);
    if (local_28 == (BuildDB *)0x0) {
      bVar3 = false;
    }
    else {
      local_20._M_head_impl = local_28;
      local_28 = (BuildDB *)0x0;
      bVar3 = core::BuildEngine::attachDB
                        ((BuildEngine *)((long)pvVar2 + 0x108),
                         (unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
                          *)&local_20,error_out);
      if (local_20._M_head_impl != (BuildDB *)0x0) {
        (*(local_20._M_head_impl)->_vptr_BuildDB[1])();
      }
      local_20._M_head_impl = (BuildDB *)0x0;
    }
    if (local_28 != (BuildDB *)0x0) {
      (*local_28->_vptr_BuildDB[1])();
    }
    return bVar3;
  }
  __assert_fail("clientVersion <= (1 << 16) && \"unsupported client version\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                ,0x121,"uint32_t (anonymous namespace)::BuildSystemImpl::getMergedSchemaVersion()");
}

Assistant:

bool BuildSystem::attachDB(StringRef path,
                                std::string* error_out) {
  return static_cast<BuildSystemImpl*>(impl)->attachDB(path, error_out);
}